

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

string * __thiscall
flatbuffers::FloatConstantGenerator::GenFloatConstant_abi_cxx11_
          (string *__return_storage_ptr__,FloatConstantGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  
  BVar1 = (field->value).type.base_type;
  if (BVar1 == BASE_TYPE_DOUBLE) {
    GenFloatConstantImpl<double>(__return_storage_ptr__,this,field);
  }
  else {
    if (BVar1 != BASE_TYPE_FLOAT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/code_generators.cpp"
                    ,0xf1,
                    "std::string flatbuffers::FloatConstantGenerator::GenFloatConstant(const FieldDef &) const"
                   );
    }
    GenFloatConstantImpl<float>(__return_storage_ptr__,this,field);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FloatConstantGenerator::GenFloatConstant(
    const FieldDef &field) const {
  switch (field.value.type.base_type) {
    case BASE_TYPE_FLOAT: return GenFloatConstantImpl<float>(field);
    case BASE_TYPE_DOUBLE: return GenFloatConstantImpl<double>(field);
    default: {
      FLATBUFFERS_ASSERT(false);
      return "INVALID_BASE_TYPE";
    }
  };
}